

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O1

uint __thiscall
ON_FixedSizePool::ResetElementId(ON_FixedSizePool *this,size_t id_offset,uint initial_id)

{
  ulong uVar1;
  undefined8 *puVar2;
  void *pvVar3;
  char *sFormat;
  int line_number;
  undefined8 *puVar4;
  undefined8 *puVar5;
  uint *puVar6;
  void **ppvVar7;
  
  uVar1 = this->m_sizeof_element;
  if ((uVar1 & 3) == 0) {
    if (id_offset < 8) {
      sFormat = "id_offset is too small.";
      line_number = 0x455;
    }
    else {
      if (id_offset + 4 <= uVar1) {
        if ((undefined8 *)this->m_first_block == (undefined8 *)0x0) {
          return initial_id;
        }
        puVar2 = (undefined8 *)this->m_al_block;
        puVar4 = (undefined8 *)this->m_first_block;
        do {
          if (puVar4 == puVar2) {
            puVar5 = (undefined8 *)0x0;
            ppvVar7 = &this->m_al_element_array;
          }
          else {
            puVar5 = (undefined8 *)*puVar4;
            ppvVar7 = (void **)(puVar4 + 1);
          }
          pvVar3 = *ppvVar7;
          if (uVar1 <= (ulong)((long)pvVar3 - (long)(puVar4 + 2))) {
            for (puVar6 = (uint *)((long)(puVar4 + 2) + id_offset);
                puVar6 <= (uint *)((long)pvVar3 + (id_offset - uVar1));
                puVar6 = (uint *)((long)puVar6 + (uVar1 & 0xfffffffffffffffc))) {
              *puVar6 = initial_id;
              initial_id = initial_id + 1;
            }
          }
          puVar4 = puVar5;
        } while (puVar5 != (undefined8 *)0x0);
        return initial_id;
      }
      sFormat = "id_offset is too large.";
      line_number = 0x45b;
    }
  }
  else {
    sFormat = "m_sizeof_element must be a multiple of sizeof(unsigned int).";
    line_number = 0x44f;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
             ,line_number,"",sFormat);
  return 0;
}

Assistant:

unsigned int ON_FixedSizePool::ResetElementId(
  size_t id_offset,
  unsigned int initial_id
)
{
  const char* block;
  const char* block_end;
  const char* next_block;
  unsigned int* i0;
  unsigned int* i1;
  unsigned int id = initial_id;
  size_t count;
  if (0 != ( m_sizeof_element % sizeof(id)) )
  {
    // caller is confused.
    ON_ERROR("m_sizeof_element must be a multiple of sizeof(unsigned int).");
    return 0;
  }
  if (id_offset < sizeof(void*))
  {
    // caller is confused.
    ON_ERROR("id_offset is too small.");
    return 0;
  }
  if (id_offset + sizeof(id) > m_sizeof_element)
  {
    // caller is confused.
    ON_ERROR("id_offset is too large.");
    return 0;
  }

  const size_t delta_i = m_sizeof_element / sizeof(id);
  for (block = (const char*)m_first_block; 0 != block; block = next_block)
  {
    if (block == m_al_block)
    {
      next_block = nullptr;
      block_end = (const char*)m_al_element_array;
      block += (2 * sizeof(void*));
    }
    else
    {
      next_block = *((const char**)block);
      block += sizeof(void*);
      block_end = *((const char**)(block));
      block += sizeof(void*);
    }

    count = (block_end - block)/m_sizeof_element;
    if (0 == count)
      continue;

    i0 = ((unsigned int*)(block + id_offset));
    i1 = ((unsigned int*)(block_end-(m_sizeof_element-id_offset)));

    while (i0 <= i1)
    {
      *i0 = id++;
      i0 += delta_i;
    }
  }

  return id;
}